

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# char.c
# Opt level: O2

void dmrC_get_char_constant(dmr_C *C,token *token,unsigned_long_long *val)

{
  string *psVar1;
  uint uVar2;
  long lVar3;
  char *pcVar4;
  string *p;
  uint uVar5;
  char *end;
  uint local_2c [2];
  uint v;
  
  p = (string *)&token->field_2;
  uVar5 = SUB84(token->pos,0);
  uVar2 = uVar5 & 0x3f;
  if (uVar2 - 6 < 4) {
    end = (char *)((long)p + ((ulong)(uVar5 & 0x3f) - 5));
    lVar3 = 0x18;
  }
  else {
    if ((uVar2 == 10) || (uVar2 == 5)) {
      psVar1 = *(string **)p;
      p = psVar1 + 1;
      end = &psVar1->field_0x3 + ((uint)*psVar1 & 0x7fffffff);
    }
    else {
      end = (char *)((long)p + ((ulong)(uVar5 & 0x3f) - 10));
    }
    lVar3 = 0x30;
    if (uVar2 < 10) {
      lVar3 = 0x18;
    }
  }
  pcVar4 = parse_escape(C,(char *)p,local_2c,end,*(int *)((long)&C->target->size_t_ctype + lVar3),
                        token->pos);
  if (pcVar4 != end) {
    dmrC_warning(C,token->pos,"multi-character character constant");
  }
  *val = (ulong)local_2c[0];
  return;
}

Assistant:

void dmrC_get_char_constant(struct dmr_C *C, struct token *token, unsigned long long *val)
{
	const char *p = token->embedded, *end;
	unsigned v;
	int type = dmrC_token_type(token);
	switch (type) {
	case TOKEN_CHAR:
	case TOKEN_WIDE_CHAR:
		p = token->string->data;
		end = p + token->string->length - 1;
		break;
	case TOKEN_CHAR_EMBEDDED_0:
	case TOKEN_CHAR_EMBEDDED_1:
	case TOKEN_CHAR_EMBEDDED_2:
	case TOKEN_CHAR_EMBEDDED_3:
		end = p + type - TOKEN_CHAR;
		break;
	default:
		end = p + type - TOKEN_WIDE_CHAR;
	}
	p = parse_escape(C, p, &v, end,
			type < TOKEN_WIDE_CHAR ? C->target->bits_in_char : C->target->bits_in_wchar, token->pos);
	if (p != end)
		dmrC_warning(C, token->pos,
			"multi-character character constant");
	*val = v;
}